

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::RawHashSamplerTest_DISABLED_Sample_Test::
~RawHashSamplerTest_DISABLED_Sample_Test(RawHashSamplerTest_DISABLED_Sample_Test *this)

{
  RawHashSamplerTest_DISABLED_Sample_Test *this_local;
  
  ~RawHashSamplerTest_DISABLED_Sample_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(RawHashSamplerTest, DISABLED_Sample) {
  // Enable the feature even if the prod default is off.
  SetHashtablezEnabled(true);
  SetHashtablezSampleParameter(100);

  auto& sampler = HashtablezSampler::Global();
  size_t start_size = 0;
  start_size += sampler.Iterate([&](const HashtablezInfo&) { ++start_size; });

  std::vector<IntTable> tables;
  for (int i = 0; i < 1000000; ++i) {
    tables.emplace_back();
    tables.back().insert(1);
  }
  size_t end_size = 0;
  end_size += sampler.Iterate([&](const HashtablezInfo&) { ++end_size; });

  EXPECT_NEAR((end_size - start_size) / static_cast<double>(tables.size()),
              0.01, 0.005);
}